

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

int64 Js::JavascriptArray::GetIndexFromVar(Var arg,int64 length,ScriptContext *scriptContext)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double T1;
  
  bVar1 = TaggedInt::Is(arg);
  if (bVar1) {
    uVar2 = TaggedInt::ToInt32(arg);
    uVar3 = 0;
    if (0 < (int)uVar2 + length) {
      uVar3 = (int)uVar2 + length;
    }
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 0) {
      uVar4 = uVar3;
    }
    if (length <= (long)uVar4) {
      uVar4 = length;
    }
  }
  else {
    T1 = JavascriptConversion::ToInteger(arg,scriptContext);
    uVar4 = length;
    if ((T1 <= (double)length) &&
       (uVar3 = NumberUtilities::TryToInt64(T1), uVar4 = uVar3, (long)uVar3 < 0)) {
      uVar4 = 0;
      if (0 < (long)(uVar3 + length)) {
        uVar4 = uVar3 + length;
      }
    }
  }
  return uVar4;
}

Assistant:

int64 JavascriptArray::GetIndexFromVar(Js::Var arg, int64 length, ScriptContext* scriptContext)
    {
        int64 index;

        if (TaggedInt::Is(arg))
        {
            int intValue = TaggedInt::ToInt32(arg);

            if (intValue < 0)
            {
                index = max<int64>(0, length + intValue);
            }
            else
            {
                index = intValue;
            }

            if (index > length)
            {
                index = length;
            }
        }
        else
        {
            double doubleValue = JavascriptConversion::ToInteger(arg, scriptContext);

            // Handle the Number.POSITIVE_INFINITY case
            if (doubleValue > length)
            {
                return length;
            }

            index = NumberUtilities::TryToInt64(doubleValue);

            if (index < 0)
            {
                index = max<int64>(0, index + length);
            }
        }

        return index;
    }